

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * pcache1Alloc(int nByte)

{
  int N;
  int in_EDI;
  int sz;
  void *p;
  PgFreeslot *pPVar1;
  
  pPVar1 = (PgFreeslot *)0x0;
  if (in_EDI <= pcache1_g.szSlot) {
    sqlite3_mutex_enter((sqlite3_mutex *)0x1670dd);
    pPVar1 = pcache1_g.pFree;
    if (pcache1_g.pFree != (PgFreeslot *)0x0) {
      pcache1_g.nFreeSlot = pcache1_g.nFreeSlot + -1;
      pcache1_g.bUnderPressure = (int)(pcache1_g.nFreeSlot < pcache1_g.nReserve);
      pcache1_g.pFree = (pcache1_g.pFree)->pNext;
      sqlite3StatusHighwater(7,in_EDI);
      sqlite3StatusUp(1,1);
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x167151);
  }
  if ((pPVar1 == (PgFreeslot *)0x0) &&
     (pPVar1 = (PgFreeslot *)sqlite3Malloc(0), pPVar1 != (PgFreeslot *)0x0)) {
    N = sqlite3MallocSize((void *)0x16717a);
    sqlite3_mutex_enter((sqlite3_mutex *)0x16718a);
    sqlite3StatusHighwater(7,in_EDI);
    sqlite3StatusUp(2,N);
    sqlite3_mutex_leave((sqlite3_mutex *)0x1671b2);
  }
  return pPVar1;
}

Assistant:

static void *pcache1Alloc(int nByte){
  void *p = 0;
  assert( sqlite3_mutex_notheld(pcache1.grp.mutex) );
  if( nByte<=pcache1.szSlot ){
    sqlite3_mutex_enter(pcache1.mutex);
    p = (PgHdr1 *)pcache1.pFree;
    if( p ){
      pcache1.pFree = pcache1.pFree->pNext;
      pcache1.nFreeSlot--;
      pcache1.bUnderPressure = pcache1.nFreeSlot<pcache1.nReserve;
      assert( pcache1.nFreeSlot>=0 );
      sqlite3StatusHighwater(SQLITE_STATUS_PAGECACHE_SIZE, nByte);
      sqlite3StatusUp(SQLITE_STATUS_PAGECACHE_USED, 1);
    }
    sqlite3_mutex_leave(pcache1.mutex);
  }
  if( p==0 ){
    /* Memory is not available in the SQLITE_CONFIG_PAGECACHE pool.  Get
    ** it from sqlite3Malloc instead.
    */
    p = sqlite3Malloc(nByte);
#ifndef SQLITE_DISABLE_PAGECACHE_OVERFLOW_STATS
    if( p ){
      int sz = sqlite3MallocSize(p);
      sqlite3_mutex_enter(pcache1.mutex);
      sqlite3StatusHighwater(SQLITE_STATUS_PAGECACHE_SIZE, nByte);
      sqlite3StatusUp(SQLITE_STATUS_PAGECACHE_OVERFLOW, sz);
      sqlite3_mutex_leave(pcache1.mutex);
    }
#endif
    sqlite3MemdebugSetType(p, MEMTYPE_PCACHE);
  }
  return p;
}